

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_both.cc
# Opt level: O0

bool bssl::tls13_add_key_update(SSL *ssl,int request_type)

{
  StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *this;
  _func_bool_SSL_ptr_CBB_ptr_CBB_ptr_uint8_t *p_Var1;
  bool bVar2;
  int iVar3;
  cbb_st *pcVar4;
  short sVar5;
  undefined1 local_80 [8];
  CBB body_cbb;
  ScopedCBB cbb;
  int request_type_local;
  SSL *ssl_local;
  
  if ((*(ushort *)&ssl->s3->field_0xdc >> 8 & 1) != 0) {
    return true;
  }
  iVar3 = SSL_is_dtls(ssl);
  if ((iVar3 != 0) &&
     (bVar2 = InplaceVector<bssl::DTLSOutgoingMessage,_7UL>::empty(&ssl->d1->outgoing_messages),
     !bVar2)) {
    sVar5 = 1;
    if (request_type == 1) {
      sVar5 = 2;
    }
    *(ushort *)ssl->d1 = *(ushort *)ssl->d1 & 0xfe7f | sVar5 << 7;
    return true;
  }
  this = (StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&body_cbb.u + 0x18);
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated(this);
  p_Var1 = ssl->method->init_message;
  pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get(this);
  bVar2 = (*p_Var1)(ssl,pcVar4,(CBB *)local_80,'\x18');
  if (bVar2) {
    cbb.ctx_.u._28_1_ = (undefined1)request_type;
    iVar3 = CBB_add_u8((CBB *)local_80,cbb.ctx_.u._28_1_);
    if (iVar3 != 0) {
      pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                          ((long)&body_cbb.u + 0x18));
      bVar2 = ssl_add_message_cbb(ssl,pcVar4);
      if (bVar2) {
        iVar3 = SSL_is_dtls(ssl);
        if ((iVar3 != 0) || (bVar2 = tls13_rotate_traffic_key(ssl,evp_aead_seal), bVar2)) {
          *(ushort *)&ssl->s3->field_0xdc = *(ushort *)&ssl->s3->field_0xdc | 0x100;
          (*ssl->method->finish_flight)(ssl);
          ssl_local._7_1_ = true;
        }
        else {
          ssl_local._7_1_ = false;
        }
        goto LAB_001c96c7;
      }
    }
  }
  ssl_local._7_1_ = false;
LAB_001c96c7:
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&body_cbb.u + 0x18));
  return ssl_local._7_1_;
}

Assistant:

bool tls13_add_key_update(SSL *ssl, int request_type) {
  if (ssl->s3->key_update_pending) {
    return true;
  }

  // We do not support multiple parallel outgoing flights. If there is an
  // outgoing flight pending, queue the KeyUpdate for later.
  if (SSL_is_dtls(ssl) && !ssl->d1->outgoing_messages.empty()) {
    ssl->d1->queued_key_update = request_type == SSL_KEY_UPDATE_REQUESTED
                                     ? QueuedKeyUpdate::kUpdateRequested
                                     : QueuedKeyUpdate::kUpdateNotRequested;
    return true;
  }

  ScopedCBB cbb;
  CBB body_cbb;
  if (!ssl->method->init_message(ssl, cbb.get(), &body_cbb,
                                 SSL3_MT_KEY_UPDATE) ||
      !CBB_add_u8(&body_cbb, request_type) ||
      !ssl_add_message_cbb(ssl, cbb.get())) {
    return false;
  }

  // In DTLS, the actual key update is deferred until KeyUpdate is ACKed.
  if (!SSL_is_dtls(ssl) && !tls13_rotate_traffic_key(ssl, evp_aead_seal)) {
    return false;
  }

  // Suppress KeyUpdate acknowledgments until this change is written to the
  // wire. This prevents us from accumulating write obligations when read and
  // write progress at different rates. See RFC 8446, section 4.6.3.
  ssl->s3->key_update_pending = true;
  ssl->method->finish_flight(ssl);
  return true;
}